

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_fe.cc
# Opt level: O0

shared_ptr<spdlog::logger> * lf::uscalfe::LinearFeLocalLoadVectorLogger(void)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  if (LinearFeLocalLoadVectorLogger()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&LinearFeLocalLoadVectorLogger()::logger);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"lf::uscalfe::LinearFeLocalLoadVectorLogger",&local_29);
      lf::base::InitLogger((base *)&LinearFeLocalLoadVectorLogger::logger,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::shared_ptr<spdlog::logger>::~shared_ptr,
                   &LinearFeLocalLoadVectorLogger::logger,&__dso_handle);
      __cxa_guard_release(&LinearFeLocalLoadVectorLogger()::logger);
    }
  }
  return &LinearFeLocalLoadVectorLogger::logger;
}

Assistant:

std::shared_ptr<spdlog::logger> &LinearFeLocalLoadVectorLogger() {
  static auto logger =
      base::InitLogger("lf::uscalfe::LinearFeLocalLoadVectorLogger");
  return logger;
}